

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

_Bool extent_decommit_wrapper
                (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent,
                size_t offset,size_t length)

{
  code *pcVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  void *pvVar5;
  size_t sVar6;
  extent_t *in_RCX;
  long *in_RDX;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  _Bool err;
  tsd_t *tsd;
  uint8_t state;
  extent_hooks_t **in_stack_ffffffffffffff38;
  arena_t *in_stack_ffffffffffffff40;
  _Bool local_b1;
  arena_t *in_stack_ffffffffffffff50;
  long lVar7;
  tsdn_t *in_stack_ffffffffffffff58;
  byte local_7a;
  witness_tsdn_t *local_38;
  
  if (in_RDI == 0) {
    local_38 = (witness_tsdn_t *)0x0;
  }
  else {
    local_38 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_assert_depth_to_rank(local_38,0xc,0);
  extent_hooks_assure_initialized(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((extent_hooks_t *)*in_RDX != &extent_hooks_default) {
    extent_hook_pre_reentrancy(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  local_7a = 1;
  if (*(long *)(*in_RDX + 0x20) != 0) {
    pcVar1 = *(code **)(*in_RDX + 0x20);
    lVar7 = *in_RDX;
    pvVar5 = extent_base_get(in_RCX);
    sVar6 = extent_size_get(in_RCX);
    uVar4 = arena_ind_get((arena_t *)0x167b08);
    local_7a = (*pcVar1)(lVar7,pvVar5,sVar6,in_R8,in_R9,uVar4);
  }
  if ((extent_hooks_t *)*in_RDX != &extent_hooks_default) {
    extent_hook_post_reentrancy((tsdn_t *)in_stack_ffffffffffffff40);
  }
  _Var3 = extent_committed_get(in_RCX);
  local_b1 = false;
  _Var2 = (_Bool)(local_7a & 1);
  if (!_Var3) {
    _Var2 = local_b1;
  }
  local_b1 = _Var2;
  extent_committed_set(in_RCX,local_b1);
  return (_Bool)(local_7a & 1);
}

Assistant:

bool
extent_decommit_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent, size_t offset,
    size_t length) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);

	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	bool err = ((*r_extent_hooks)->decommit == NULL ||
	    (*r_extent_hooks)->decommit(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), offset, length,
	    arena_ind_get(arena)));
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	extent_committed_set(extent, extent_committed_get(extent) && err);
	return err;
}